

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

bool __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::ImplicitProducer::
enqueue<(ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>
          (ImplicitProducer *this,
          unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
          *element)

{
  ulong blockStartIndex;
  long *plVar1;
  bool bVar2;
  BlockIndexEntry *in_RAX;
  Block *pBVar3;
  BlockIndexEntry *idxEntry;
  BlockIndexEntry *local_28;
  
  blockStartIndex = *(ulong *)(this + 0x20);
  if ((blockStartIndex & 0x1f) == 0) {
    if ((*(long *)(this + 0x28) - blockStartIndex) + 0x7fffffffffffffdf < 0x7fffffffffffffff) {
      local_28 = in_RAX;
      bVar2 = insert_block_index_entry<(ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
                        (this,&local_28,blockStartIndex);
      if (bVar2) {
        pBVar3 = requisition_block<(ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
                           (*(ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
                              **)(this + 0x50));
        if (pBVar3 != (Block *)0x0) {
          (pBVar3->elementsCompletelyDequeued).super___atomic_base<unsigned_long>._M_i = 0;
          (local_28->value)._M_b._M_p = pBVar3;
          *(Block **)(this + 0x40) = pBVar3;
          goto LAB_001c0033;
        }
        plVar1 = *(long **)(this + 0x60);
        plVar1[1] = *plVar1 - 1U & plVar1[1] - 1U;
        (local_28->value)._M_b._M_p = (__pointer_type)0x0;
      }
    }
    bVar2 = false;
  }
  else {
    pBVar3 = *(Block **)(this + 0x40);
LAB_001c0033:
    *(coro_http_client **)(pBVar3->elements + (blockStartIndex & 0x1f) * 8) =
         (element->_M_t).
         super___uniq_ptr_impl<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
         ._M_t.
         super__Tuple_impl<0UL,_cinatra::coro_http_client_*,_std::default_delete<cinatra::coro_http_client>_>
         .super__Head_base<0UL,_cinatra::coro_http_client_*,_false>._M_head_impl;
    (element->_M_t).
    super___uniq_ptr_impl<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
    ._M_t.
    super__Tuple_impl<0UL,_cinatra::coro_http_client_*,_std::default_delete<cinatra::coro_http_client>_>
    .super__Head_base<0UL,_cinatra::coro_http_client_*,_false>._M_head_impl =
         (coro_http_client *)0x0;
    *(ulong *)(this + 0x20) = blockStartIndex + 1;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

inline bool enqueue(U&& element) {
      index_t currentTailIndex =
          this->tailIndex.load(std::memory_order_relaxed);
      index_t newTailIndex = 1 + currentTailIndex;
      if ((currentTailIndex & static_cast<index_t>(QUEUE_BLOCK_SIZE - 1)) ==
          0) {
        // We reached the end of a block, start a new one
        auto head = this->headIndex.load(std::memory_order_relaxed);
        assert(!details::circular_less_than<index_t>(currentTailIndex, head));
        if (!details::circular_less_than<index_t>(
                head, currentTailIndex + QUEUE_BLOCK_SIZE) ||
            (MAX_SUBQUEUE_SIZE != details::const_numeric_max<size_t>::value &&
             (MAX_SUBQUEUE_SIZE == 0 || MAX_SUBQUEUE_SIZE - QUEUE_BLOCK_SIZE <
                                            currentTailIndex - head))) {
          return false;
        }
#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODBLOCKINDEX
        debug::DebugLock lock(mutex);
#endif
        // Find out where we'll be inserting this block in the block index
        BlockIndexEntry* idxEntry;
        if (!insert_block_index_entry<allocMode>(idxEntry, currentTailIndex)) {
          return false;
        }

        // Get ahold of a new block
        auto newBlock =
            this->parent
                ->ConcurrentQueue::template requisition_block<allocMode>();
        if (newBlock == nullptr) {
          rewind_block_index_tail();
          idxEntry->value.store(nullptr, std::memory_order_relaxed);
          return false;
        }
#ifdef MCDBGQ_TRACKMEM
        newBlock->owner = this;
#endif
        newBlock
            ->ConcurrentQueue::Block::template reset_empty<implicit_context>();

        MOODYCAMEL_CONSTEXPR_IF(!MOODYCAMEL_NOEXCEPT_CTOR(
            T, U, new (static_cast<T*>(nullptr)) T(std::forward<U>(element)))) {
          // May throw, try to insert now before we publish the fact that we
          // have this new block
          MOODYCAMEL_TRY {
            new ((*newBlock)[currentTailIndex]) T(std::forward<U>(element));
          }
          MOODYCAMEL_CATCH(...) {
            rewind_block_index_tail();
            idxEntry->value.store(nullptr, std::memory_order_relaxed);
            this->parent->add_block_to_free_list(newBlock);
            MOODYCAMEL_RETHROW;
          }
        }

        // Insert the new block into the index
        idxEntry->value.store(newBlock, std::memory_order_relaxed);

        this->tailBlock = newBlock;

        MOODYCAMEL_CONSTEXPR_IF(!MOODYCAMEL_NOEXCEPT_CTOR(
            T, U, new (static_cast<T*>(nullptr)) T(std::forward<U>(element)))) {
          this->tailIndex.store(newTailIndex, std::memory_order_release);
          return true;
        }
      }